

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm_x86.h
# Opt level: O0

Reg asm_load_lightud64(ASMState *as,IRIns *ir,int typecheck)

{
  MCode *pMVar1;
  Reg r2;
  int in_EDX;
  ASMState *in_RSI;
  ASMState *in_RDI;
  Reg tmp;
  Reg dest;
  undefined4 in_stack_ffffffffffffffd8;
  RegSet in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  Reg local_4;
  
  if ((((*(byte *)((long)in_RSI->cost + 6) & 0x80) == 0) ||
      (*(char *)((long)in_RSI->cost + 7) != '\0')) || (in_EDX != 0)) {
    local_4 = ra_dest((ASMState *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),
                      (IRIns *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),0);
    if (in_EDX != 0) {
      r2 = ra_scratch((ASMState *)CONCAT44(in_EDX,local_4),in_stack_ffffffffffffffdc);
      asm_guardcc(in_RSI,in_EDX);
      pMVar1 = in_RDI->mcp;
      in_RDI->mcp = pMVar1 + -1;
      pMVar1[-1] = 0xfe;
      emit_rr(in_RDI,XO_ARITHi8,7,r2);
      pMVar1 = in_RDI->mcp;
      in_RDI->mcp = pMVar1 + -1;
      pMVar1[-1] = '/';
      emit_rr(in_RDI,XO_SHIFTi,0x80207,r2);
      emit_rr(in_RDI,XO_MOV,r2 | 0x80200,local_4);
    }
  }
  else {
    local_4 = 0x80;
  }
  return local_4;
}

Assistant:

static Reg asm_load_lightud64(ASMState *as, IRIns *ir, int typecheck)
{
  if (ra_used(ir) || typecheck) {
    Reg dest = ra_dest(as, ir, RSET_GPR);
    if (typecheck) {
      Reg tmp = ra_scratch(as, rset_exclude(RSET_GPR, dest));
      asm_guardcc(as, CC_NE);
      emit_i8(as, -2);
      emit_rr(as, XO_ARITHi8, XOg_CMP, tmp);
      emit_shifti(as, XOg_SAR|REX_64, tmp, 47);
      emit_rr(as, XO_MOV, tmp|REX_64, dest);
    }
    return dest;
  } else {
    return RID_NONE;
  }
}